

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.cpp
# Opt level: O3

void NULLCIO::GetKeyboardState(NULLCArray arr)

{
  nullcThrowError("GetKeyboardState: supported only under Windows",arr.len);
  return;
}

Assistant:

void GetKeyboardState(NULLCArray arr)
	{
#if defined(_MSC_VER)
		if(arr.len < 256)
			nullcThrowError("GetKeyboardState requires array with 256 or more elements");

		::GetKeyboardState((unsigned char*)arr.ptr);
#elif defined(EMSCRIPTEN)
		if(arr.len < 256)
			nullcThrowError("GetKeyboardState requires array with 256 or more elements");

		int numKeys = 0;
		const Uint8* keys = SDL_GetKeyboardState(&numKeys);

		for(int i = 0; i < numKeys && i < arr.len; i++)
			((unsigned char*)arr.ptr)[i] = keys[i];
#else
		(void)arr;

		nullcThrowError("GetKeyboardState: supported only under Windows");
#endif
	}